

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<16,_8,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int col_1;
  undefined8 in_RAX;
  bool bVar3;
  long lVar4;
  undefined8 *puVar5;
  int col;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  undefined1 auStack_88 [8];
  Matrix<float,_2,_3> res;
  undefined1 auStack_68 [8];
  Mat3x2 m_1;
  undefined1 auStack_48 [8];
  Mat3x2 m;
  float local_28 [4];
  int aiStack_18 [5];
  undefined4 uStack_4;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    puVar5 = (undefined8 *)auStack_48;
    bVar11 = true;
    do {
      bVar3 = bVar11;
      lVar6 = 0;
      auVar7 = _DAT_019fcc00;
      do {
        bVar11 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 != lVar6) {
            uVar12 = 0;
          }
          *(undefined4 *)(puVar5 + lVar6) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 + -1 != lVar6) {
            uVar12 = 0;
          }
          *(undefined4 *)(puVar5 + lVar6 + 1) = uVar12;
        }
        lVar6 = lVar6 + 2;
        lVar10 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar10 + 2;
      } while (lVar6 != 4);
      lVar4 = 1;
      puVar5 = (undefined8 *)((long)auStack_48 + 4);
      bVar11 = false;
    } while (bVar3);
    auStack_48 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    m.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    m.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    m.m_data.m_data[1].m_data[0] = 0.0;
    m.m_data.m_data[1].m_data[1] = 0.0;
    lVar4 = 0;
    puVar5 = (undefined8 *)auStack_48;
    bVar11 = true;
    do {
      bVar3 = bVar11;
      lVar6 = 0;
      do {
        *(undefined4 *)(puVar5 + lVar6) =
             *(undefined4 *)((long)&s_constInMat3x2 + lVar4 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar4 = 0xc;
      puVar5 = (undefined8 *)((long)auStack_48 + 4);
      bVar11 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    puVar5 = (undefined8 *)auStack_68;
    bVar11 = true;
    do {
      bVar3 = bVar11;
      lVar6 = 0;
      auVar8 = _DAT_019fcc00;
      do {
        bVar11 = SUB164(auVar8 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 != lVar6) {
            uVar12 = 0;
          }
          *(undefined4 *)(puVar5 + lVar6) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 + -1 != lVar6) {
            uVar12 = 0;
          }
          *(undefined4 *)(puVar5 + lVar6 + 1) = uVar12;
        }
        lVar6 = lVar6 + 2;
        lVar10 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar10 + 2;
      } while (lVar6 != 4);
      lVar4 = 1;
      puVar5 = (undefined8 *)((long)auStack_68 + 4);
      bVar11 = false;
    } while (bVar3);
    auStack_68 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    m_1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    m_1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    m_1.m_data.m_data[0].m_data[0] = 0.0;
    m_1.m_data.m_data[0].m_data[1] = 0.0;
    m_1.m_data.m_data[1].m_data[0] = 0.0;
    m_1.m_data.m_data[1].m_data[1] = 0.0;
    lVar4 = 0;
    puVar5 = (undefined8 *)auStack_68;
    bVar11 = true;
    do {
      bVar3 = bVar11;
      lVar6 = 0;
      do {
        *(undefined4 *)(puVar5 + lVar6) = *(undefined4 *)((long)&DAT_01bf4528 + lVar6 * 4 + lVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar4 = 0xc;
      puVar5 = (undefined8 *)((long)auStack_68 + 4);
      bVar11 = false;
    } while (bVar3);
  }
  lVar4 = 0;
  puVar5 = (undefined8 *)auStack_88;
  bVar11 = true;
  do {
    bVar3 = bVar11;
    lVar6 = 0;
    auVar9 = _DAT_019fcc00;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_019f5ce0,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar5 + lVar6) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 + -1 != lVar6) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar5 + lVar6 + 1) = uVar12;
      }
      lVar6 = lVar6 + 2;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while (lVar6 != 4);
    lVar4 = 1;
    puVar5 = (undefined8 *)((long)auStack_88 + 4);
    bVar11 = false;
  } while (bVar3);
  lVar4 = 0;
  do {
    uVar1 = *(undefined8 *)m.m_data.m_data[lVar4 + -1].m_data;
    uVar2 = *(undefined8 *)m_1.m_data.m_data[lVar4 + -1].m_data;
    *(ulong *)res.m_data.m_data[lVar4 + -1].m_data =
         CONCAT44((float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20),
                  (float)uVar1 - (float)uVar2);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  stack0xfffffffffffffff8 = CONCAT44((int)((ulong)in_RAX >> 0x20),2);
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar4]] = local_28[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}